

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_dffbc4::HandleExportMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer puVar2;
  cmTargetExport *pcVar3;
  bool bVar4;
  PolicyStatus PVar5;
  string *psVar6;
  long lVar7;
  cmGlobalGenerator *pcVar8;
  cmTarget *this;
  string *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_4;
  string *__args_5;
  pointer puVar9;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  bool exportOld;
  undefined1 local_3ca [2];
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_3c8;
  string local_3c0;
  string fname;
  MessageLevel message;
  cmExportSet *local_378;
  cmAlphaNum local_370;
  undefined1 local_340 [56];
  string exp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  Helper helper;
  string cxx_modules_directory;
  string filename;
  string name_space;
  string local_238;
  ParseResult local_218;
  cmInstallCommandArguments ica;
  
  Helper::Helper(&helper,status);
  std::__cxx11::string::string((string *)&local_238,(string *)&helper.DefaultComponentName);
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  exp._M_dataplus._M_p = (pointer)&exp.field_2;
  exp._M_string_length = 0;
  name_space._M_dataplus._M_p = (pointer)&name_space.field_2;
  name_space._M_string_length = 0;
  exp.field_2._M_local_buf[0] = '\0';
  name_space.field_2._M_local_buf[0] = '\0';
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  exportOld = false;
  filename.field_2._M_local_buf[0] = '\0';
  cxx_modules_directory._M_dataplus._M_p = (pointer)&cxx_modules_directory.field_2;
  cxx_modules_directory._M_string_length = 0;
  cxx_modules_directory.field_2._M_local_buf[0] = '\0';
  name.super_string_view._M_str = "EXPORT";
  name.super_string_view._M_len = 6;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(&ica.super_cmArgumentParser<void>,name,&exp);
  name_00.super_string_view._M_str = "NAMESPACE";
  name_00.super_string_view._M_len = 9;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_00,&name_space);
  name_01.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
  name_01.super_string_view._M_len = 0x1f;
  cmArgumentParser<void>::Bind<bool>(&ica.super_cmArgumentParser<void>,name_01,&exportOld);
  name_02.super_string_view._M_str = "FILE";
  name_02.super_string_view._M_len = 4;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_02,&filename);
  bVar4 = cmExperimental::HasSupportEnabled(helper.Makefile,CxxModuleCMakeApi);
  if (bVar4) {
    name_03.super_string_view._M_str = "CXX_MODULES_DIRECTORY";
    name_03.super_string_view._M_len = 0x15;
    cmArgumentParser<void>::Bind<std::__cxx11::string>
              (&ica.super_cmArgumentParser<void>,name_03,&cxx_modules_directory);
  }
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_218,&ica.super_cmArgumentParser<void>,args,&unknownArgs,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_218);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = cmInstallCommandArguments::Finalize(&ica);
    if (bVar4) {
      psVar6 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
      if (psVar6->_M_string_length == 0) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_340._8_8_ = (pbVar1->_M_dataplus)._M_p;
        local_340._0_8_ = pbVar1->_M_string_length;
        local_370.View_._M_len = 0x16;
        local_370.View_._M_str = " given no DESTINATION!";
        cmStrCat<>(&fname,(cmAlphaNum *)local_340,&local_370);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00307924;
      }
      std::__cxx11::string::string((string *)&fname,(string *)&filename);
      lVar7 = std::__cxx11::string::find_first_of((char *)&fname,0x635f0b);
      if (lVar7 == -1) {
        if (fname._M_string_length != 0) {
          cmsys::SystemTools::GetFilenameLastExtension((string *)local_340,&fname);
          bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_340,".cmake");
          std::__cxx11::string::~string((string *)local_340);
          if (!bVar4) {
            if (fname._M_string_length == 0) goto LAB_00307b6d;
            goto LAB_00307c41;
          }
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_340._8_8_ = (pbVar1->_M_dataplus)._M_p;
          local_340._0_8_ = pbVar1->_M_string_length;
          local_370.View_._M_len = 0x21;
          local_370.View_._M_str = " given invalid export file name \"";
          cmStrCat<std::__cxx11::string,char[62]>
                    (&local_3c0,(cmAlphaNum *)local_340,&local_370,&fname,
                     (char (*) [62])
                     "\".  The FILE argument must specify a name ending in \".cmake\".");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_003079e7;
        }
LAB_00307b6d:
        local_340._0_8_ = exp._M_string_length;
        local_340._8_8_ = exp._M_dataplus._M_p;
        local_370.View_._M_len = (size_t)&DAT_00000006;
        local_370.View_._M_str = ".cmake";
        cmStrCat<>(&local_3c0,(cmAlphaNum *)local_340,&local_370);
        std::__cxx11::string::operator=((string *)&fname,(string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3c0);
        lVar7 = std::__cxx11::string::find_first_of((char *)&fname,0x635f0b);
        if (lVar7 != -1) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_340._8_8_ = (pbVar1->_M_dataplus)._M_p;
          local_340._0_8_ = pbVar1->_M_string_length;
          local_370.View_._M_len = 0x14;
          local_370.View_._M_str = " given export name \"";
          cmStrCat<std::__cxx11::string,char[144]>
                    (&local_3c0,(cmAlphaNum *)local_340,&local_370,&exp,
                     (char (*) [144])
                     "\".  This name cannot be safely converted to a file name.  Specify a different export name or use the FILE option to set a file name explicitly."
                    );
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_003079e7;
        }
LAB_00307c41:
        pcVar8 = cmMakefile::GetGlobalGenerator(helper.Makefile);
        local_378 = cmExportSetMap::operator[](&pcVar8->ExportSets,&exp);
        if (exportOld == true) {
          puVar2 = (local_378->TargetExports).
                   super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar9 = (local_378->TargetExports).
                        super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar2;
              puVar9 = puVar9 + 1) {
            pcVar8 = cmMakefile::GetGlobalGenerator(helper.Makefile);
            this = cmGlobalGenerator::FindTarget
                             (pcVar8,&((puVar9->_M_t).
                                       super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                                       .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)
                                      ->TargetName,false);
            if (this == (cmTarget *)0x0) {
LAB_00307e19:
              local_340._0_8_ = (pointer)0x4d;
              local_340._8_8_ =
                   "INSTALL(EXPORT) given keyword \"EXPORT_LINK_INTERFACE_LIBRARIES\", but target \""
              ;
              pcVar3 = (puVar9->_M_t).
                       super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                       .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
              local_370.View_._M_str = (pcVar3->TargetName)._M_dataplus._M_p;
              local_370.View_._M_len = (pcVar3->TargetName)._M_string_length;
              cmStrCat<char[43]>(&local_3c0,(cmAlphaNum *)local_340,&local_370,
                                 (char (*) [43])"\" does not have policy CMP0022 set to NEW.");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_003079e7;
            }
            PVar5 = cmTarget::GetPolicyStatusCMP0022(this);
            if (PVar5 == WARN) goto LAB_00307e19;
            PVar5 = cmTarget::GetPolicyStatusCMP0022(this);
            if (PVar5 == OLD) goto LAB_00307e19;
          }
        }
        message = cmInstallGenerator::SelectMessageLevel(helper.Makefile,false);
        local_340._48_8_ = helper.Makefile;
        local_3c0._M_dataplus._M_p = (pointer)local_378;
        psVar6 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
        __args_3 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(&ica);
        __args_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmInstallCommandArguments::GetConfigurations_abi_cxx11_(&ica);
        __args_5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        local_3ca[1] = cmInstallCommandArguments::GetExcludeFromAll(&ica);
        local_3ca[0] = 0;
        cmMakefile::GetBacktrace((cmMakefile *)local_340);
        std::
        make_unique<cmInstallExportGenerator,cmExportSet*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,bool&,bool,cmListFileBacktrace>
                  ((cmExportSet **)&local_370,&local_3c0,psVar6,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)__args_3,__args_4,(MessageLevel *)__args_5,(bool *)&message,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_3ca + 1),&fname,&name_space,(bool *)&cxx_modules_directory,&exportOld,
                   (cmListFileBacktrace *)local_3ca);
        local_3c8._M_head_impl = (cmInstallGenerator *)local_370.View_._M_len;
        local_370.View_._M_len = 0;
        cmMakefile::AddInstallGenerator
                  ((cmMakefile *)local_340._48_8_,
                   (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                   &local_3c8);
        if (local_3c8._M_head_impl != (cmInstallGenerator *)0x0) {
          (*((local_3c8._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
        }
        local_3c8._M_head_impl = (cmInstallGenerator *)0x0;
        if ((long *)local_370.View_._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_370.View_._M_len + 8))();
        }
        local_370.View_._M_len = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_340 + 8));
        bVar4 = true;
      }
      else {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_340._8_8_ = (pbVar1->_M_dataplus)._M_p;
        local_340._0_8_ = pbVar1->_M_string_length;
        local_370.View_._M_len = 0x21;
        local_370.View_._M_str = " given invalid export file name \"";
        cmStrCat<std::__cxx11::string,char[93]>
                  (&local_3c0,(cmAlphaNum *)local_340,&local_370,&fname,
                   (char (*) [93])
                   "\".  The FILE argument may not contain a path.  Specify the path in the DESTINATION argument."
                  );
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_003079e7:
        std::__cxx11::string::~string((string *)&local_3c0);
        bVar4 = false;
      }
      std::__cxx11::string::~string((string *)&fname);
      goto LAB_00307a01;
    }
  }
  else {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_340._8_8_ = (pbVar1->_M_dataplus)._M_p;
    local_340._0_8_ = pbVar1->_M_string_length;
    local_370.View_._M_len = 0x19;
    local_370.View_._M_str = " given unknown argument \"";
    cmStrCat<std::__cxx11::string,char[3]>
              (&fname,(cmAlphaNum *)local_340,&local_370,
               unknownArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(char (*) [3])0x617de4);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00307924:
    std::__cxx11::string::~string((string *)&fname);
  }
  bVar4 = false;
LAB_00307a01:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  std::__cxx11::string::~string((string *)&cxx_modules_directory);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&name_space);
  std::__cxx11::string::~string((string *)&exp);
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  std::__cxx11::string::~string((string *)&helper.DefaultComponentName);
  return bVar4;
}

Assistant:

bool HandleExportMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the EXPORT mode.
  cmInstallCommandArguments ica(helper.DefaultComponentName);

  std::string exp;
  std::string name_space;
  bool exportOld = false;
  std::string filename;
  std::string cxx_modules_directory;

  ica.Bind("EXPORT"_s, exp);
  ica.Bind("NAMESPACE"_s, name_space);
  ica.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, exportOld);
  ica.Bind("FILE"_s, filename);

  bool const supportCxx20FileSetTypes = cmExperimental::HasSupportEnabled(
    *helper.Makefile, cmExperimental::Feature::CxxModuleCMakeApi);
  if (supportCxx20FileSetTypes) {
    ica.Bind("CXX_MODULES_DIRECTORY"_s, cxx_modules_directory);
  }

  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Check the file name.
  std::string fname = filename;
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(cmStrCat(args[0], " given invalid export file name \"",
                             fname,
                             "\".  "
                             "The FILE argument may not contain a path.  "
                             "Specify the path in the DESTINATION argument."));
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".cmake") {
    status.SetError(
      cmStrCat(args[0], " given invalid export file name \"", fname,
               "\".  "
               "The FILE argument must specify a name ending in \".cmake\"."));
    return false;
  }

  // Construct the file name.
  if (fname.empty()) {
    fname = cmStrCat(exp, ".cmake");

    if (fname.find_first_of(":/\\") != std::string::npos) {
      status.SetError(cmStrCat(
        args[0], " given export name \"", exp,
        "\".  "
        "This name cannot be safely converted to a file name.  "
        "Specify a different export name or use the FILE option to set "
        "a file name explicitly."));
      return false;
    }
  }

  cmExportSet& exportSet =
    helper.Makefile->GetGlobalGenerator()->GetExportSets()[exp];
  if (exportOld) {
    for (auto const& te : exportSet.GetTargetExports()) {
      cmTarget* tgt =
        helper.Makefile->GetGlobalGenerator()->FindTarget(te->TargetName);
      const bool newCMP0022Behavior =
        (tgt && tgt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::OLD);

      if (!newCMP0022Behavior) {
        status.SetError(cmStrCat(
          "INSTALL(EXPORT) given keyword \""
          "EXPORT_LINK_INTERFACE_LIBRARIES\", but target \"",
          te->TargetName, "\" does not have policy CMP0022 set to NEW."));
        return false;
      }
    }
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);

  // Create the export install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallExportGenerator>(
      &exportSet, ica.GetDestination(), ica.GetPermissions(),
      ica.GetConfigurations(), ica.GetComponent(), message,
      ica.GetExcludeFromAll(), fname, name_space, cxx_modules_directory,
      exportOld, false, helper.Makefile->GetBacktrace()));

  return true;
}